

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

void __thiscall
slang::IntervalMap<int,_int,_0U>::overlap_iterator::unionWith
          (overlap_iterator *this,int *value,allocator_type *alloc)

{
  Path *other;
  Path *this_00;
  uint32_t *puVar1;
  IntervalMap<int,_int,_0U> *pIVar2;
  pointer pEVar3;
  size_type sVar4;
  interval<int> iVar5;
  void *pvVar6;
  IntervalMap<int,_int,_0U> *pIVar7;
  undefined8 uVar8;
  allocator_type *paVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  allocator_type *paVar13;
  ulong uVar14;
  int iVar15;
  allocator_type *paVar16;
  BranchNode<int,_12U,_true> *self;
  int iVar17;
  iterator nextIt;
  iterator local_70;
  
  pIVar2 = (this->super_iterator).super_const_iterator.map;
  uVar12 = pIVar2->rootSize;
  if (pIVar2->height == 0) {
    if (uVar12 != 0) {
      iVar15 = (this->searchKey).left;
      paVar13 = (allocator_type *)0x0;
      paVar16 = alloc;
      do {
        if (*(int *)((long)&pIVar2->field_0 + (long)paVar13 * 8) < iVar15) {
          iVar17 = *(int *)((long)&pIVar2->field_0 + (long)paVar13 * 8 + 4) + 1;
          bVar10 = iVar17 < iVar15;
          paVar9 = paVar16;
          if (iVar15 <= iVar17) {
            paVar9 = paVar13;
          }
        }
        else {
          bVar10 = false;
          paVar9 = paVar13;
        }
        paVar16 = (allocator_type *)((ulong)paVar9 & 0xffffffff);
        if (!bVar10) {
          uVar12 = (uint)paVar9;
          break;
        }
        paVar13 = (allocator_type *)((long)&paVar13->alloc + 1);
      } while ((allocator_type *)(ulong)uVar12 != paVar13);
    }
    const_iterator::setRoot((const_iterator *)this,uVar12);
  }
  else {
    if (uVar12 != 0) {
      iVar15 = (this->searchKey).left;
      paVar13 = (allocator_type *)0x0;
      paVar16 = alloc;
      do {
        if (*(int *)((long)&pIVar2->field_0 + (long)paVar13 * 8 + 0x60) < iVar15) {
          iVar17 = *(int *)((long)&pIVar2->field_0 + (long)paVar13 * 8 + 100) + 1;
          bVar10 = iVar17 < iVar15;
          paVar9 = paVar16;
          if (iVar15 <= iVar17) {
            paVar9 = paVar13;
          }
        }
        else {
          bVar10 = false;
          paVar9 = paVar13;
        }
        paVar16 = (allocator_type *)((ulong)paVar9 & 0xffffffff);
        if (!bVar10) {
          uVar12 = (uint)paVar9;
          break;
        }
        paVar13 = (allocator_type *)((long)&paVar13->alloc + 1);
      } while ((allocator_type *)(ulong)uVar12 != paVar13);
    }
    const_iterator::setRoot((const_iterator *)this,uVar12);
    treeFindUnion(this);
  }
  if (((this->super_iterator).super_const_iterator.path.path.
       super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len == 0) ||
     (other = &(this->super_iterator).super_const_iterator.path,
     pEVar3 = (other->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_,
     pEVar3->size <= pEVar3->offset)) {
    IntervalMap<int,_int,_0U>::iterator::insert
              (&this->super_iterator,(this->searchKey).left,(this->searchKey).right,value,alloc);
    return;
  }
  pEVar3 = (this->super_iterator).super_const_iterator.path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  sVar4 = (this->super_iterator).super_const_iterator.path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  uVar14 = (ulong)pEVar3[sVar4 - 1].offset;
  iVar15 = (this->searchKey).left;
  if ((*(int *)((long)pEVar3[sVar4 - 1].node + uVar14 * 8 + 4) + 1 < iVar15) ||
     ((this->searchKey).right + 1 < *(int *)((long)pEVar3[sVar4 - 1].node + uVar14 * 8))) {
    IntervalMap<int,_int,_0U>::iterator::insert
              (&this->super_iterator,iVar15,(this->searchKey).right,value,alloc);
  }
  else {
    iVar5 = this->searchKey;
    pvVar6 = pEVar3[sVar4 - 1].node;
    iVar15 = *(int *)((long)pvVar6 + uVar14 * 8);
    iVar17 = *(int *)((long)pvVar6 + uVar14 * 8 + 4);
    iVar11 = iVar5.left;
    if (iVar11 < iVar15) {
      iVar15 = iVar11;
    }
    *(int *)((long)pvVar6 + uVar14 * 8) = iVar15;
    iVar15 = iVar5.right;
    if (iVar15 < iVar17) {
      iVar15 = iVar17;
    }
    *(int *)((long)pvVar6 + uVar14 * 8 + 4) = iVar15;
    this->searchKey = *(interval<int> *)((long)pvVar6 + uVar14 * 8);
    IntervalMap<int,_int,_0U>::iterator::updateParentBounds
              (&this->super_iterator,(int)sVar4 - 1,&this->searchKey);
  }
  this_00 = &local_70.super_const_iterator.path;
LAB_0050fc1e:
  do {
    pIVar7 = (this->super_iterator).super_const_iterator.map;
    pEVar3 = (this->super_iterator).super_const_iterator.path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    sVar4 = (this->super_iterator).super_const_iterator.path.path.
            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
    uVar14 = (ulong)pEVar3[sVar4 - 1].offset;
    uVar12 = pEVar3[sVar4 - 1].offset + 1;
    if (uVar12 < pEVar3[sVar4 - 1].size) {
      if (*(int *)((long)pEVar3[sVar4 - 1].node + (ulong)uVar12 * 8) <= (this->searchKey).right + 1)
      {
        uVar8 = *(undefined8 *)((long)pEVar3[sVar4 - 1].node + (ulong)uVar12 * 8);
        pvVar6 = pEVar3[sVar4 - 1].node;
        iVar15 = *(int *)((long)pvVar6 + uVar14 * 8);
        iVar17 = *(int *)((long)pvVar6 + uVar14 * 8 + 4);
        iVar11 = (int)uVar8;
        if (iVar11 < iVar15) {
          iVar15 = iVar11;
        }
        *(int *)((long)pvVar6 + uVar14 * 8) = iVar15;
        iVar15 = (int)((ulong)uVar8 >> 0x20);
        if (iVar15 < iVar17) {
          iVar15 = iVar17;
        }
        *(int *)((long)pvVar6 + uVar14 * 8 + 4) = iVar15;
        this->searchKey = *(interval<int> *)((long)pvVar6 + uVar14 * 8);
        pEVar3[sVar4 - 1].offset = uVar12;
        IntervalMap<int,_int,_0U>::iterator::erase(&this->super_iterator,alloc,false);
        puVar1 = &(this->super_iterator).super_const_iterator.path.path.
                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                  [(this->super_iterator).super_const_iterator.path.path.
                   super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].offset;
        *puVar1 = *puVar1 - 1;
        goto LAB_0050fc1e;
      }
    }
    if (pIVar7->height == 0) {
      return;
    }
    if (uVar12 != pEVar3[sVar4 - 1].size) {
      return;
    }
    local_70.super_const_iterator.map = pIVar7;
    SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL>::SmallVector
              (&this_00->path,(Base *)other);
    IntervalMapDetails::Path::moveRight(this_00,pIVar2->height);
    if ((((local_70.super_const_iterator.path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len == 0) ||
         ((local_70.super_const_iterator.path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->size <=
          (local_70.super_const_iterator.path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->offset)) ||
        (local_70.super_const_iterator.path.path.
         super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
         [local_70.super_const_iterator.path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].size == 0)) ||
       ((this->searchKey).right + 1 <
        *local_70.super_const_iterator.path.path.
         super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
         [local_70.super_const_iterator.path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].node)) {
      if (local_70.super_const_iterator.path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
          (pointer)local_70.super_const_iterator.path.path.
                   super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.firstElement) {
        operator_delete(local_70.super_const_iterator.path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
      }
      return;
    }
    uVar8 = *local_70.super_const_iterator.path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
             [local_70.super_const_iterator.path.path.
              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].node;
    pEVar3 = (this->super_iterator).super_const_iterator.path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    sVar4 = (this->super_iterator).super_const_iterator.path.path.
            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
    uVar14 = (ulong)pEVar3[sVar4 - 1].offset;
    pvVar6 = pEVar3[sVar4 - 1].node;
    iVar15 = *(int *)((long)pvVar6 + uVar14 * 8);
    iVar17 = *(int *)((long)pvVar6 + uVar14 * 8 + 4);
    iVar11 = (int)uVar8;
    if (iVar11 < iVar15) {
      iVar15 = iVar11;
    }
    *(int *)((long)pvVar6 + uVar14 * 8) = iVar15;
    iVar15 = (int)((ulong)uVar8 >> 0x20);
    if (iVar15 < iVar17) {
      iVar15 = iVar17;
    }
    *(int *)((long)pvVar6 + uVar14 * 8 + 4) = iVar15;
    this->searchKey = *(interval<int> *)((long)pvVar6 + uVar14 * 8);
    IntervalMap<int,_int,_0U>::iterator::updateParentBounds
              (&this->super_iterator,(int)sVar4 - 1,&this->searchKey);
    bVar10 = IntervalMap<int,_int,_0U>::iterator::erase(&local_70,alloc,true);
    if (bVar10) {
      SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator=
                ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)other,
                 (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)this_00);
      IntervalMapDetails::Path::moveLeft(other,pIVar2->height);
    }
    if (local_70.super_const_iterator.path.path.
        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
        (pointer)local_70.super_const_iterator.path.path.
                 super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.firstElement) {
      operator_delete(local_70.super_const_iterator.path.path.
                      super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
    }
  } while( true );
}

Assistant:

void IntervalMap<TKey, TValue, N>::overlap_iterator::unionWith(const TValue& value,
                                                               allocator_type& alloc) {
    using namespace IntervalMapDetails;

    auto& map = *this->map;
    auto& path = this->path;
    if (this->isFlat()) {
        this->setRoot(map.rootLeaf.findUnionLeft(0, map.rootSize, searchKey));
    }
    else {
        this->setRoot(map.rootBranch.findUnionLeft(0, map.rootSize, searchKey));
        treeFindUnion();
    }

    // The iterator now points to one of the following:
    // - The first existing interval that overlaps (or is adjacent to) the search key
    // - The correct place to insert the search key as a new interval
    // - The end of the map (also the correct place to insert)
    if (!valid()) {
        // We're at the end of the map so just insert and we're done.
        this->insert(searchKey.left, searchKey.right, value, alloc);
        return;
    }

    auto getCurrKey = [&]() -> interval<TKey>& {
        auto offset = path.leafOffset();
        return this->isFlat() ? path.template leaf<RootLeaf>().keyAt(offset)
                              : path.template leaf<Leaf>().keyAt(offset);
    };

    auto updateCurrKey = [&](interval<TKey> newKey) {
        // Expand the current entry to match our new item.
        auto& currKey = getCurrKey();
        currKey.unionWith(newKey);
        searchKey = currKey;
    };

    if (!getCurrKey().overlapsOrAdjacent(searchKey)) {
        this->insert(searchKey.left, searchKey.right, value, alloc);
    }
    else {
        // Otherwise expand the current entry to match our new item.
        updateCurrKey(searchKey);
        this->updateParentBounds(path.height(), searchKey);
    }

    // Our new interval is inserted or updated. Continue forward and
    // merge all later intervals that overlap with this one.
    while (true) {
        uint32_t offset = path.leafOffset() + 1;
        bool canUnionRight;
        interval<TKey> currKey;
        if (this->isFlat()) {
            auto& leaf = path.template leaf<RootLeaf>();
            canUnionRight = leaf.canUnionRight(offset, path.leafSize(), searchKey);
            currKey = leaf.keyAt(offset);
        }
        else {
            auto& leaf = path.template leaf<Leaf>();
            canUnionRight = leaf.canUnionRight(offset, path.leafSize(), searchKey);
            currKey = leaf.keyAt(offset);
        }

        if (canUnionRight) {
            // This does not change our parent bounds so no need to update.
            updateCurrKey(currKey);

            path.leafOffset() = offset;
            bool modifiedPath = this->erase(alloc, false);
            SLANG_ASSERT(!modifiedPath);

            path.leafOffset()--;
        }
        else if (offset == path.leafSize() && !this->isFlat()) {
            // Copy our iterator and advance to the next node to see if we can merge
            // with it. This intentionally slices the object since we don't need the
            // wider overlapped_iterator here.
            iterator nextIt = *this;
            nextIt.path.moveRight(map.height);
            if (!nextIt.valid() || !nextIt.path.template leaf<Leaf>().canUnionRight(
                                       0, nextIt.path.leafSize(), searchKey)) {
                // Nope, we're done.
                return;
            }

            // Merge and erase the next elem.
            updateCurrKey(nextIt.path.template leaf<Leaf>().keyAt(0));
            this->updateParentBounds(path.height(), searchKey);

            if (nextIt.erase(alloc, true)) {
                // The erase operation deleted nodes so our path is invalid.
                // Get back to a good state by copying from the nextIt's path
                // and then moving back left.
                path = nextIt.path;
                path.moveLeft(map.height);
            }
        }
        else {
            return;
        }
    }
}